

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

BOOL LOADInitializeModules(void)

{
  void *pvVar1;
  BOOL BVar2;
  
  if (exe_module.prev == (_MODSTRUCT *)0x0) {
    InternalInitializeCriticalSection(&module_critsec);
    pvVar1 = exe_module.dl_handle;
    if (PAL_InitializeChakraCoreCalled != false) {
      exe_module.self = &exe_module;
      BVar2 = 1;
      exe_module.dl_handle = (void *)dlopen(0,1);
      if (exe_module.dl_handle == (void *)0x0) {
        pvVar1 = (void *)0x0;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012bb8b;
        dlerror();
        BVar2 = 0;
      }
      else {
        exe_module.refcount = -1;
        exe_module.threadLibCalls = 1;
        exe_module.next = &exe_module;
        exe_module.prev = &exe_module;
        exe_module.pDllMain = (PDLLMAIN)0x0;
        exe_module.hinstance = (HINSTANCE)0x0;
        exe_module.lib_name = (LPWSTR)0x0;
      }
      return BVar2;
    }
  }
  else {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0x34d,"exe_module.prev == nullptr","");
    fflush(_stderr);
    pvVar1 = exe_module.dl_handle;
  }
LAB_0012bb8b:
  exe_module.dl_handle = pvVar1;
  abort();
}

Assistant:

BOOL LOADInitializeModules()
{
    _ASSERTE(exe_module.prev == nullptr);

    InternalInitializeCriticalSection(&module_critsec);

    // Initialize module for main executable
    TRACE("Initializing module for main executable\n");

    exe_module.self = (HMODULE)&exe_module;
    exe_module.dl_handle = dlopen(nullptr, RTLD_LAZY);
    if (exe_module.dl_handle == nullptr)
    {
        ERROR("Executable module will be broken : dlopen(nullptr) failed dlerror message is \"%s\" \n", dlerror());
        return FALSE;
    }
    exe_module.lib_name = nullptr;
    exe_module.refcount = -1;
    exe_module.next = &exe_module;
    exe_module.prev = &exe_module;
    exe_module.pDllMain = nullptr;
    exe_module.hinstance = nullptr;
    exe_module.threadLibCalls = TRUE;
    return TRUE;
}